

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O0

string * __thiscall
tinyusdz::to_string_abi_cxx11_(string *__return_storage_ptr__,tinyusdz *this,StereoRole *role)

{
  allocator local_1b;
  allocator local_1a;
  allocator local_19;
  tinyusdz *local_18;
  StereoRole *role_local;
  
  local_18 = this;
  role_local = (StereoRole *)__return_storage_ptr__;
  if (*(int *)this == 0) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,"mono",&local_19);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_19);
  }
  else if (*(int *)this == 2) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,"right",&local_1a);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_1a);
  }
  else {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,"left",&local_1b);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_1b);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string to_string(const GeomCamera::StereoRole &role) {
  if (role == GeomCamera::StereoRole::Mono) {
    return "mono";
  } else if (role == GeomCamera::StereoRole::Right) {
    return "right";
  } else {
    return "left";
  }
}